

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

char * mg_next_comma_list_entry(char *list,mg_str *val,mg_str *eq_val)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  
  if ((list == (char *)0x0) || (*list == '\0')) {
    pcVar2 = (char *)0x0;
  }
  else {
    val->p = list;
    pcVar2 = strchr(list,0x2c);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(list);
      pcVar2 = list + sVar3;
      val->len = sVar3;
    }
    else {
      val->len = (long)pcVar2 - (long)list;
      pcVar2 = pcVar2 + 1;
    }
    if (eq_val != (mg_str *)0x0) {
      eq_val->len = 0;
      sVar3 = val->len;
      pcVar4 = (char *)memchr(list,0x3d,sVar3);
      eq_val->p = pcVar4;
      if (pcVar4 != (char *)0x0) {
        eq_val->p = pcVar4 + 1;
        pcVar1 = val->p;
        eq_val->len = (size_t)(pcVar1 + (sVar3 - (long)(pcVar4 + 1)));
        val->len = (size_t)(pcVar4 + ~(ulong)pcVar1 + 1);
      }
    }
  }
  return pcVar2;
}

Assistant:

const char *mg_next_comma_list_entry(const char *list, struct mg_str *val,
                                     struct mg_str *eq_val) {
    if (list == NULL || *list == '\0') {
        /* End of the list */
        list = NULL;
    } else {
        val->p = list;
        if ((list = strchr(val->p, ',')) != NULL) {
            /* Comma found. Store length and shift the list ptr */
            val->len = list - val->p;
            list++;
        } else {
            /* This value is the last one */
            list = val->p + strlen(val->p);
            val->len = list - val->p;
        }

        if (eq_val != NULL) {
            /* Value has form "x=y", adjust pointers and lengths */
            /* so that val points to "x", and eq_val points to "y". */
            eq_val->len = 0;
            eq_val->p = (const char *) memchr(val->p, '=', val->len);
            if (eq_val->p != NULL) {
                eq_val->p++; /* Skip over '=' character */
                eq_val->len = val->p + val->len - eq_val->p;
                val->len = (eq_val->p - val->p) - 1;
            }
        }
    }

    return list;
}